

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTools.cxx
# Opt level: O2

void cmsys::SystemTools::AddKeepPath(string *dir)

{
  string cdir;
  string local_48;
  string local_28;
  
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  local_48._M_string_length = 0;
  local_48.field_2._M_local_buf[0] = '\0';
  CollapseFullPath(&local_28,dir);
  Realpath(&local_28,&local_48,(string *)0x0);
  std::__cxx11::string::~string((string *)&local_28);
  AddTranslationPath(&local_48,dir);
  std::__cxx11::string::~string((string *)&local_48);
  return;
}

Assistant:

void SystemTools::AddKeepPath(const std::string& dir)
{
  std::string cdir;
  Realpath(SystemTools::CollapseFullPath(dir), cdir);
  SystemTools::AddTranslationPath(cdir, dir);
}